

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

bool __thiscall Matrix::lu(Matrix *this,int32_t *idx,FLOAT *d,FLOAT eps)

{
  uint uVar1;
  FLOAT **ppFVar2;
  FLOAT *pFVar3;
  void *__ptr;
  ostream *poVar4;
  FLOAT *pFVar5;
  int iVar6;
  FLOAT *pFVar7;
  FLOAT *pFVar8;
  FLOAT *pFVar9;
  FLOAT *pFVar10;
  bool bVar11;
  FLOAT *pFVar12;
  FLOAT FVar13;
  double dVar14;
  double dVar15;
  
  uVar1 = this->m;
  pFVar12 = (FLOAT *)(ulong)uVar1;
  if (uVar1 != this->n) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "ERROR: Trying to LU decompose a matrix of size (");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,this->m);
    poVar4 = std::operator<<(poVar4,"x");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,this->n);
    poVar4 = std::operator<<(poVar4,")");
    std::endl<char,std::char_traits<char>>(poVar4);
    exit(0);
  }
  __ptr = malloc((long)(int)uVar1 * 8);
  *d = 1.0;
  if ((int)uVar1 < 1) {
    bVar11 = true;
  }
  else {
    ppFVar2 = this->val;
    pFVar5 = (FLOAT *)0x0;
    bVar11 = false;
    do {
      pFVar7 = ppFVar2[(long)pFVar5];
      pFVar8 = (FLOAT *)0x0;
      dVar14 = 0.0;
      do {
        dVar15 = ABS(pFVar7[(long)pFVar8]);
        if (ABS(pFVar7[(long)pFVar8]) <= dVar14) {
          dVar15 = dVar14;
        }
        pFVar8 = (FLOAT *)((long)pFVar8 + 1);
        dVar14 = dVar15;
      } while (pFVar12 != pFVar8);
      if ((dVar15 == 0.0) && (!NAN(dVar15))) goto LAB_00103ff7;
      *(double *)((long)__ptr + (long)pFVar5 * 8) = 1.0 / dVar15;
      pFVar5 = (FLOAT *)((long)pFVar5 + 1);
      bVar11 = (long)(int)uVar1 <= (long)pFVar5;
    } while (pFVar5 != pFVar12);
    ppFVar2 = this->val;
    pFVar5 = (FLOAT *)0x1;
    pFVar8 = (FLOAT *)0x0;
    do {
      if (pFVar8 != (FLOAT *)0x0) {
        pFVar9 = (FLOAT *)0x0;
        do {
          pFVar3 = ppFVar2[(long)pFVar9];
          FVar13 = pFVar3[(long)pFVar8];
          if (pFVar9 != (FLOAT *)0x0) {
            pFVar10 = (FLOAT *)0x0;
            do {
              FVar13 = FVar13 - pFVar3[(long)pFVar10] * ppFVar2[(long)pFVar10][(long)pFVar8];
              pFVar10 = (FLOAT *)((long)pFVar10 + 1);
            } while (pFVar9 != pFVar10);
          }
          pFVar3[(long)pFVar8] = FVar13;
          pFVar9 = (FLOAT *)((long)pFVar9 + 1);
        } while (pFVar9 != pFVar8);
      }
      if ((long)pFVar8 < (long)(int)pFVar12) {
        dVar14 = 0.0;
        pFVar9 = pFVar8;
        do {
          pFVar3 = ppFVar2[(long)pFVar9];
          FVar13 = pFVar3[(long)pFVar8];
          if (pFVar8 != (FLOAT *)0x0) {
            pFVar10 = (FLOAT *)0x0;
            do {
              FVar13 = FVar13 - pFVar3[(long)pFVar10] * ppFVar2[(long)pFVar10][(long)pFVar8];
              pFVar10 = (FLOAT *)((long)pFVar10 + 1);
            } while (pFVar8 != pFVar10);
          }
          pFVar3[(long)pFVar8] = FVar13;
          dVar15 = ABS(FVar13) * *(double *)((long)__ptr + (long)pFVar9 * 8);
          if (dVar14 <= dVar15) {
            pFVar7 = pFVar9;
          }
          pFVar7 = (FLOAT *)((ulong)pFVar7 & 0xffffffff);
          dVar14 = (double)(-(ulong)(dVar15 < dVar14) & (ulong)dVar14 |
                           ~-(ulong)(dVar15 < dVar14) & (ulong)dVar15);
          pFVar9 = (FLOAT *)((long)pFVar9 + 1);
        } while (pFVar9 != pFVar12);
      }
      iVar6 = (int)pFVar7;
      if (pFVar8 != (FLOAT *)((ulong)pFVar7 & 0xffffffff)) {
        if (0 < (int)pFVar12) {
          pFVar9 = ppFVar2[iVar6];
          pFVar3 = ppFVar2[(long)pFVar8];
          pFVar10 = (FLOAT *)0x0;
          do {
            FVar13 = pFVar9[(long)pFVar10];
            pFVar9[(long)pFVar10] = pFVar3[(long)pFVar10];
            pFVar3[(long)pFVar10] = FVar13;
            pFVar10 = (FLOAT *)((long)pFVar10 + 1);
          } while (pFVar12 != pFVar10);
        }
        *d = -*d;
        *(undefined8 *)((long)__ptr + (long)iVar6 * 8) =
             *(undefined8 *)((long)__ptr + (long)pFVar8 * 8);
      }
      idx[(long)pFVar8] = iVar6;
      uVar1 = this->n;
      pFVar12 = (FLOAT *)(ulong)uVar1;
      if ((pFVar8 != (FLOAT *)(ulong)(uVar1 - 1)) && ((long)((long)pFVar8 + 1U) < (long)(int)uVar1))
      {
        dVar14 = ppFVar2[(long)pFVar8][(long)pFVar8];
        pFVar9 = pFVar5;
        do {
          ppFVar2[(long)pFVar9][(long)pFVar8] = ppFVar2[(long)pFVar9][(long)pFVar8] * (1.0 / dVar14)
          ;
          pFVar9 = (FLOAT *)((long)pFVar9 + 1);
        } while (pFVar12 != pFVar9);
      }
      pFVar8 = (FLOAT *)((long)pFVar8 + 1);
      pFVar5 = (FLOAT *)((long)pFVar5 + 1);
    } while ((long)pFVar8 < (long)(int)uVar1);
  }
LAB_00103ff7:
  free(__ptr);
  return bVar11;
}

Assistant:

bool Matrix::lu(int32_t *idx, FLOAT &d, FLOAT eps) {
  
  if (m != n) {
    cerr << "ERROR: Trying to LU decompose a matrix of size (" << m << "x" << n << ")" << endl;
    exit(0);
  }
  
  int32_t i,imax,j,k;
  FLOAT   big,dum,sum,temp;
  FLOAT* vv = (FLOAT*)malloc(n*sizeof(FLOAT)); // vv stores the implicit scaling of each row.
  d = 1.0;
  for (i=0; i<n; i++) { // Loop over rows to get the implicit scaling information.
    big = 0.0;
    for (j=0; j<n; j++)
      if ((temp=fabs(val[i][j]))>big)
        big = temp;
    if (big == 0.0) { // No nonzero largest element.
      free(vv);
      return false;
    }
    vv[i] = 1.0/big; // Save the scaling.
  }
  for (j=0; j<n; j++) { // This is the loop over columns of Crout’s method.
    for (i=0; i<j; i++) { // This is equation (2.3.12) except for i = j.
      sum = val[i][j];
      for (k=0; k<i; k++)
        sum -= val[i][k]*val[k][j];
      val[i][j] = sum;
    }
    big = 0.0; // Initialize the search for largest pivot element.
    for (i=j; i<n; i++) {
      sum = val[i][j];
      for (k=0; k<j; k++)
        sum -= val[i][k]*val[k][j];
      val[i][j] = sum;
      if ( (dum=vv[i]*fabs(sum))>=big) {
        big  = dum;
        imax = i;
      }
    }
    if (j!=imax) { // Do we need to interchange rows?
      for (k=0; k<n; k++) { // Yes, do so...
        dum          = val[imax][k];
        val[imax][k] = val[j][k];
        val[j][k]    = dum;
      }
      d = -d;     // ...and change the parity of d.
      vv[imax]=vv[j]; // Also interchange the scale factor.
    }
    idx[j] = imax;
    if (j!=n-1) { // Now, finally, divide by the pivot element.
      dum = 1.0/val[j][j];
      for (i=j+1; i<n; i++)
        val[i][j] *= dum;
    }
  } // Go back for the next column in the reduction.
  
  // success
  free(vv);
  return true;
}